

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O3

sds duckdb_hll::sdsjoin(char **argv,int argc,char *sep)

{
  char *__s;
  sdshdr8 *sh;
  undefined2 *puVar1;
  size_t sVar2;
  sds s;
  ulong uVar3;
  
  puVar1 = (undefined2 *)malloc(5);
  if (puVar1 == (undefined2 *)0x0) {
    s = (sds)0x0;
  }
  else {
    s = (sds)(puVar1 + 2);
    *puVar1 = 0;
    *(undefined2 *)((long)puVar1 + 3) = 1;
  }
  if (0 < argc) {
    uVar3 = 0;
    do {
      __s = argv[uVar3];
      sVar2 = strlen(__s);
      s = sdscatlen(s,__s,sVar2);
      if (argc - 1 != uVar3) {
        sVar2 = strlen(sep);
        s = sdscatlen(s,sep,sVar2);
      }
      uVar3 = uVar3 + 1;
    } while ((uint)argc != uVar3);
  }
  return s;
}

Assistant:

sds sdsjoin(char **argv, int argc, char *sep) {
    sds join = sdsempty();
    int j;

    for (j = 0; j < argc; j++) {
        join = sdscat(join, argv[j]);
        if (j != argc-1) join = sdscat(join,sep);
    }
    return join;
}